

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

opj_pi_iterator_t * opj_pi_create(opj_image_t *image,opj_cp_t *cp,OPJ_UINT32 tileno)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_tcp_t *poVar3;
  opj_tccp_t *poVar4;
  opj_pi_iterator_t *p_pi;
  size_t num;
  opj_pi_comp_t *poVar5;
  void *pvVar6;
  OPJ_UINT32 OVar7;
  uint p_nb_elements;
  ulong uVar8;
  long lVar9;
  opj_pi_iterator_t *poVar10;
  long lVar11;
  bool bVar12;
  
  if (cp->th * cp->tw <= tileno) {
    __assert_fail("tileno < cp->tw * cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x3ea,
                  "opj_pi_iterator_t *opj_pi_create(const opj_image_t *, const opj_cp_t *, OPJ_UINT32)"
                 );
  }
  poVar3 = cp->tcps;
  OVar1 = poVar3[tileno].numpocs;
  p_nb_elements = OVar1 + 1;
  p_pi = (opj_pi_iterator_t *)opj_calloc((ulong)p_nb_elements,0xf8);
  if (p_pi == (opj_pi_iterator_t *)0x0) {
LAB_00122222:
    p_pi = (opj_pi_iterator_t *)0x0;
  }
  else if (p_nb_elements != 0) {
    num = (size_t)image->numcomps;
    poVar10 = p_pi;
    OVar7 = 0;
    do {
      poVar5 = (opj_pi_comp_t *)opj_calloc(num,0x18);
      poVar10->comps = poVar5;
      if (poVar5 == (opj_pi_comp_t *)0x0) {
LAB_00122213:
        opj_pi_destroy(p_pi,p_nb_elements);
        goto LAB_00122222;
      }
      OVar2 = image->numcomps;
      poVar10->numcomps = OVar2;
      if (OVar2 == 0) {
        num = 0;
      }
      else {
        lVar11 = 0x10;
        lVar9 = 4;
        uVar8 = 0;
        do {
          poVar5 = poVar10->comps;
          poVar4 = poVar3[tileno].tccps;
          pvVar6 = opj_calloc((ulong)*(uint *)((long)poVar4->stepsizes + lVar9 + -0x1c),0x10);
          *(void **)((long)&poVar5->dx + lVar11) = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_00122213;
          *(undefined4 *)((long)poVar5 + lVar11 + -8) =
               *(undefined4 *)((long)poVar4->stepsizes + lVar9 + -0x1c);
          uVar8 = uVar8 + 1;
          num = (size_t)image->numcomps;
          lVar11 = lVar11 + 0x18;
          lVar9 = lVar9 + 0x438;
        } while (uVar8 < num);
      }
      poVar10 = poVar10 + 1;
      bVar12 = OVar7 != OVar1;
      OVar7 = OVar7 + 1;
    } while (bVar12);
  }
  return p_pi;
}

Assistant:

static opj_pi_iterator_t * opj_pi_create(const opj_image_t *image,
        const opj_cp_t *cp,
        OPJ_UINT32 tileno)
{
    /* loop*/
    OPJ_UINT32 pino, compno;
    /* number of poc in the p_pi*/
    OPJ_UINT32 l_poc_bound;

    /* pointers to tile coding parameters and components.*/
    opj_pi_iterator_t *l_pi = 00;
    opj_tcp_t *tcp = 00;
    const opj_tccp_t *tccp = 00;

    /* current packet iterator being allocated*/
    opj_pi_iterator_t *l_current_pi = 00;

    /* preconditions in debug*/
    assert(cp != 00);
    assert(image != 00);
    assert(tileno < cp->tw * cp->th);

    /* initializations*/
    tcp = &cp->tcps[tileno];
    l_poc_bound = tcp->numpocs + 1;

    /* memory allocations*/
    l_pi = (opj_pi_iterator_t*) opj_calloc((l_poc_bound),
                                           sizeof(opj_pi_iterator_t));
    if (!l_pi) {
        return NULL;
    }

    l_current_pi = l_pi;
    for (pino = 0; pino < l_poc_bound ; ++pino) {

        l_current_pi->comps = (opj_pi_comp_t*) opj_calloc(image->numcomps,
                              sizeof(opj_pi_comp_t));
        if (! l_current_pi->comps) {
            opj_pi_destroy(l_pi, l_poc_bound);
            return NULL;
        }

        l_current_pi->numcomps = image->numcomps;

        for (compno = 0; compno < image->numcomps; ++compno) {
            opj_pi_comp_t *comp = &l_current_pi->comps[compno];

            tccp = &tcp->tccps[compno];

            comp->resolutions = (opj_pi_resolution_t*) opj_calloc(tccp->numresolutions,
                                sizeof(opj_pi_resolution_t));
            if (!comp->resolutions) {
                opj_pi_destroy(l_pi, l_poc_bound);
                return 00;
            }

            comp->numresolutions = tccp->numresolutions;
        }
        ++l_current_pi;
    }
    return l_pi;
}